

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O0

int fd_flush(hFILE *fpv)

{
  int *piVar1;
  bool bVar2;
  int local_1c;
  int ret;
  hFILE_fd *fp;
  hFILE *fpv_local;
  
  do {
    local_1c = fsync(*(int *)&fpv[1].buffer);
    if (local_1c < 0) {
      piVar1 = __errno_location();
      if (*piVar1 != 0x16) {
        piVar1 = __errno_location();
        if (*piVar1 != 0x5f) goto LAB_00114344;
      }
      local_1c = 0;
    }
LAB_00114344:
    bVar2 = false;
    if (local_1c < 0) {
      piVar1 = __errno_location();
      bVar2 = *piVar1 == 4;
    }
    if (!bVar2) {
      return local_1c;
    }
  } while( true );
}

Assistant:

static int fd_flush(hFILE *fpv)
{
    hFILE_fd *fp = (hFILE_fd *) fpv;
    int ret;
    do {
#ifdef HAVE_FDATASYNC
        ret = fdatasync(fp->fd);
#else
        ret = fsync(fp->fd);
#endif
        // Ignore invalid-for-fsync(2) errors due to being, e.g., a pipe,
        // and operation-not-supported errors (Mac OS X)
        if (ret < 0 && (errno == EINVAL || errno == ENOTSUP)) ret = 0;
    } while (ret < 0 && errno == EINTR);
    return ret;
}